

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O2

FileInfo * __thiscall efsw::FileInfo::operator=(FileInfo *this,FileInfo *Other)

{
  Uint64 UVar1;
  Uint32 UVar2;
  
  std::__cxx11::string::_M_assign((string *)this);
  UVar1 = Other->Size;
  this->ModificationTime = Other->ModificationTime;
  this->Size = UVar1;
  UVar2 = Other->GroupId;
  this->OwnerId = Other->OwnerId;
  this->GroupId = UVar2;
  this->Permissions = Other->Permissions;
  this->Inode = Other->Inode;
  return this;
}

Assistant:

FileInfo& FileInfo::operator=( const FileInfo& Other ) {
	this->Filepath = Other.Filepath;
	this->Size = Other.Size;
	this->ModificationTime = Other.ModificationTime;
	this->GroupId = Other.GroupId;
	this->OwnerId = Other.OwnerId;
	this->Permissions = Other.Permissions;
	this->Inode = Other.Inode;
	return *this;
}